

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_controller.cpp
# Opt level: O0

void __thiscall r_exec::HLPController::add_requirement(HLPController *this,bool strong)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> guard;
  bool strong_local;
  HLPController *this_local;
  
  guard._M_device._7_1_ = strong;
  std::lock_guard<std::mutex>::lock_guard
            (&local_20,&(this->super_OController).super_Controller.m_reductionMutex);
  if ((guard._M_device._7_1_ & 1) == 0) {
    this->weak_requirement_count = this->weak_requirement_count + 1;
  }
  else {
    this->strong_requirement_count = this->strong_requirement_count + 1;
  }
  this->requirement_count = this->requirement_count + 1;
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void HLPController::add_requirement(bool strong)
{
    std::lock_guard<std::mutex> guard(m_reductionMutex);

    if (strong) {
        ++strong_requirement_count;
    } else {
        ++weak_requirement_count;
    }

    ++requirement_count;
}